

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

locale __thiscall
booster::locale::impl_posix::create_formatting_impl<char>
          (impl_posix *this,locale *in,shared_ptr<__locale_struct_*> *lc)

{
  num_punct_posix<char> *this_00;
  ctype_posix<char> *this_01;
  time_put_posix<char> *this_02;
  num_format<char> *this_03;
  locale local_60;
  __shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  this_00 = (num_punct_posix<char> *)operator_new(0x78);
  num_punct_posix<char>::num_punct_posix
            (this_00,*(lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             ,0);
  std::locale::locale<booster::locale::impl_posix::num_punct_posix<char>>((locale *)this,in,this_00)
  ;
  this_01 = (ctype_posix<char> *)operator_new(0x250);
  std::__shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,&lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>);
  ctype_posix<char>::ctype_posix(this_01,(shared_ptr<__locale_struct_*> *)&local_38);
  std::locale::locale<booster::locale::impl_posix::ctype_posix<char>>
            (&local_60,(locale *)this,this_01);
  std::locale::operator=((locale *)this,&local_60);
  std::locale::~locale(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  this_02 = (time_put_posix<char> *)operator_new(0x20);
  std::__shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,&lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>);
  time_put_posix<char>::time_put_posix(this_02,(shared_ptr<__locale_struct_*> *)&local_48,0);
  std::locale::locale<booster::locale::impl_posix::time_put_posix<char>>
            (&local_60,(locale *)this,this_02);
  std::locale::operator=((locale *)this,&local_60);
  std::locale::~locale(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  this_03 = (num_format<char> *)operator_new(0x20);
  std::__shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,&lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>);
  num_format<char>::num_format(this_03,(shared_ptr<__locale_struct_*> *)&local_58,0);
  std::locale::locale<booster::locale::impl_posix::num_format<char>>
            (&local_60,(locale *)this,this_03);
  std::locale::operator=((locale *)this,&local_60);
  std::locale::~locale(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  return (locale)(_Impl *)this;
}

Assistant:

std::locale create_formatting_impl(std::locale const &in,booster::shared_ptr<locale_t> lc)
{
    std::locale tmp = std::locale(in,new num_punct_posix<CharType>(*lc));
    tmp = std::locale(tmp,new ctype_posix<CharType>(lc));
    tmp = std::locale(tmp,new time_put_posix<CharType>(lc));
    tmp = std::locale(tmp,new num_format<CharType>(lc));
    return tmp;
}